

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar10._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar10._8_56_ = extraout_var;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = time_range->lower;
  auVar11._4_4_ = time_range->upper;
  auVar7 = auVar10._0_16_;
  uVar6 = vcmpps_avx512vl(auVar7,auVar11,1);
  auVar9 = vblendps_avx(auVar11,auVar7,2);
  auVar7 = vinsertps_avx(auVar7,auVar11,0x50);
  bVar5 = (bool)((byte)uVar6 & 1);
  auVar8._0_4_ = (float)((uint)bVar5 * auVar9._0_4_ | (uint)!bVar5 * auVar7._0_4_);
  bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar8._4_4_ = (uint)bVar5 * auVar9._4_4_ | (uint)!bVar5 * auVar7._4_4_;
  bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar8._8_4_ = (uint)bVar5 * auVar9._8_4_ | (uint)!bVar5 * auVar7._8_4_;
  bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar8._12_4_ = (uint)bVar5 * auVar9._12_4_ | (uint)!bVar5 * auVar7._12_4_;
  auVar9 = vmovshdup_avx(auVar8);
  if (auVar8._0_4_ <= auVar9._0_4_) {
    aVar1 = (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper
            .field_0;
    aVar2 = (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower
            .field_0;
    uVar6 = r->_begin;
    aVar3 = (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper
            .field_0;
    sVar4 = __return_storage_ptr__->end;
    if (uVar6 < r->_end) {
      vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      vbroadcastss_avx512vl(ZEXT416(0xff800000));
      do {
        auVar12._8_8_ = 0;
        auVar12._0_4_ = (this->super_Points).super_Geometry.time_range.lower;
        auVar12._4_4_ = (this->super_Points).super_Geometry.time_range.upper;
        auVar7 = vmovshdup_avx512vl(auVar12);
        auVar7 = vsubps_avx512vl(auVar7,auVar12);
        auVar8 = vsubss_avx512f(auVar9,auVar12);
        auVar7 = vdivss_avx512f(auVar8,auVar7);
        auVar7 = vmulss_avx512f(auVar7,SUB6416(ZEXT464(0x3f7ffffc),0));
        if ((uVar6 & 0xffffffff) < (((this->super_Points).vertices.items)->super_RawBufferView).num)
        {
          auVar9 = vmulss_avx512f(ZEXT416((uint)(this->super_Points).super_Geometry.fnumTimeSegments
                                         ),auVar7);
          vrndscaless_avx512f(auVar9,auVar9);
          halt_baddata();
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < r->_end);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar1;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar2;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar3;
    __return_storage_ptr__->end = sVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }